

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini_processing.cpp
# Opt level: O2

ssize_t __thiscall IniProcessing::read(IniProcessing *this,int __fd,void *__buf,size_t __nbytes)

{
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Var1;
  undefined4 in_register_00000034;
  undefined4 uVar2;
  bool ok;
  bool local_19;
  
  uVar2 = (undefined4)__nbytes;
  local_19 = false;
  _Var1._M_cur = (__node_type *)
                 IniProcessing_readHelper_abi_cxx11_
                           (this,(char *)CONCAT44(in_register_00000034,__fd),&local_19);
  if (local_19 == true) {
    _Var1._M_cur = (__node_type *)strtol(*(char **)((long)_Var1._M_cur + 0x28),(char **)0x0,0);
    uVar2 = SUB84(_Var1._M_cur,0);
  }
  *(undefined4 *)__buf = uVar2;
  return (ssize_t)_Var1._M_cur;
}

Assistant:

void IniProcessing::read(const char *key, int &dest, int defVal)
{
    bool ok = false;
    params::IniKeys::iterator e = IniProcessing_readHelper(this, key, ok);

    if(!ok)
    {
        dest = defVal;
        return;
    }

    dest = static_cast<int>(std::strtol(e->second.c_str(), nullptr, 0));
}